

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

bool ot::commissioner::utils::CaseInsensitiveEqual(string *aLhs,string *aRhs)

{
  __type_conflict1 _Var1;
  string local_58;
  string local_38;
  string *local_18;
  string *aRhs_local;
  string *aLhs_local;
  
  local_18 = aRhs;
  aRhs_local = aLhs;
  ToLower(&local_38,aLhs);
  ToLower(&local_58,local_18);
  _Var1 = std::operator==(&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return _Var1;
}

Assistant:

bool CaseInsensitiveEqual(const std::string &aLhs, const std::string &aRhs)
{
    return ToLower(aLhs) == ToLower(aRhs);
}